

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
* __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::static_resources::get_function(static_resources *this,string_type *name,error_code *ec)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
  __l;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  const_iterator it2;
  const_iterator it;
  allocator_type *in_stack_fffffffffffff2d8;
  unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e8;
  jmespath_errc in_stack_fffffffffffff2ec;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
  *in_stack_fffffffffffff2f0;
  size_type in_stack_fffffffffffff2f8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
  *in_stack_fffffffffffff300;
  iterator in_stack_fffffffffffff308;
  size_type in_stack_fffffffffffff310;
  undefined8 **ppuVar4;
  undefined1 **local_ce8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_false>
  local_b38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_false>
  local_b30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_true>
  local_b28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_true>
  local_b20;
  allocator_type local_b14 [3];
  undefined1 local_b11;
  not_null_function *local_b10;
  allocator<char> local_b01;
  undefined1 local_b00;
  undefined1 local_aff;
  undefined1 local_afe;
  undefined1 local_afd;
  undefined1 local_afc;
  undefined1 local_afb;
  undefined1 local_afa;
  undefined1 local_af9;
  undefined1 *local_af8;
  undefined8 local_af0;
  string local_ae8 [32];
  to_string_function *local_ac8;
  allocator<char> local_aba;
  undefined1 local_ab9;
  undefined1 local_ab8;
  undefined1 local_ab7;
  undefined1 local_ab6;
  undefined1 local_ab5;
  undefined1 local_ab4;
  undefined1 local_ab3;
  undefined1 local_ab2;
  undefined1 local_ab1;
  undefined1 *local_ab0;
  undefined8 local_aa8;
  string local_aa0 [32];
  to_number_function *local_a80;
  allocator<char> local_a72;
  undefined1 local_a71;
  undefined1 local_a70;
  undefined1 local_a6f;
  undefined1 local_a6e;
  undefined1 local_a6d;
  undefined1 local_a6c;
  undefined1 local_a6b;
  undefined1 local_a6a;
  undefined1 local_a69;
  undefined1 *local_a68;
  undefined8 local_a60;
  string local_a58 [32];
  to_array_function *local_a38;
  allocator<char> local_a29;
  undefined1 local_a28;
  undefined1 local_a27;
  undefined1 local_a26;
  undefined1 local_a25;
  undefined1 local_a24;
  undefined1 local_a23;
  undefined1 local_a22;
  undefined1 local_a21;
  undefined1 *local_a20;
  undefined8 local_a18;
  string local_a10 [32];
  sum_function *local_9f0;
  allocator<char> local_9e4;
  undefined1 local_9e3;
  undefined1 local_9e2;
  undefined1 local_9e1;
  undefined1 *local_9e0;
  undefined8 local_9d8;
  string local_9d0 [32];
  starts_with_function *local_9b0;
  allocator<char> local_9a4;
  undefined1 local_9a3;
  undefined1 local_9a2;
  undefined1 local_9a1;
  undefined1 local_9a0;
  undefined1 local_99f;
  undefined1 local_99e;
  undefined1 local_99d;
  undefined1 local_99c;
  undefined1 local_99b;
  undefined1 local_99a;
  undefined1 local_999;
  undefined1 *local_998;
  undefined8 local_990;
  string local_988 [32];
  reverse_function *local_968;
  allocator<char> local_960;
  undefined1 local_95f;
  undefined1 local_95e;
  undefined1 local_95d;
  undefined1 local_95c;
  undefined1 local_95b;
  undefined1 local_95a;
  undefined1 local_959;
  undefined1 *local_958;
  undefined8 local_950;
  string local_948 [32];
  values_function *local_928;
  allocator<char> local_91f;
  undefined1 local_91e;
  undefined1 local_91d;
  undefined1 local_91c;
  undefined1 local_91b;
  undefined1 local_91a;
  undefined1 local_919;
  undefined1 *local_918;
  undefined8 local_910;
  string local_908 [32];
  keys_function *local_8e8;
  allocator<char> local_8dd;
  undefined1 local_8dc;
  undefined1 local_8db;
  undefined1 local_8da;
  undefined1 local_8d9;
  undefined1 *local_8d8;
  undefined8 local_8d0;
  string local_8c8 [32];
  sort_by_function *local_8a8;
  allocator<char> local_8a0;
  undefined1 local_89f;
  undefined1 local_89e;
  undefined1 local_89d;
  undefined1 local_89c;
  undefined1 local_89b;
  undefined1 local_89a;
  undefined1 local_899;
  undefined1 *local_898;
  undefined8 local_890;
  string local_888 [32];
  sort_function *local_868;
  allocator<char> local_85d;
  undefined1 local_85c;
  undefined1 local_85b;
  undefined1 local_85a;
  undefined1 local_859;
  undefined1 *local_858;
  undefined8 local_850;
  string local_848 [32];
  type_function *local_828;
  allocator<char> local_81d;
  undefined1 local_81c;
  undefined1 local_81b;
  undefined1 local_81a;
  undefined1 local_819;
  undefined1 *local_818;
  undefined8 local_810;
  string local_808 [32];
  merge_function *local_7e8;
  allocator<char> local_7de;
  undefined1 local_7dd;
  undefined1 local_7dc;
  undefined1 local_7db;
  undefined1 local_7da;
  undefined1 local_7d9;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  string local_7c8 [32];
  min_by_function *local_7a8;
  allocator<char> local_79f;
  undefined1 local_79e;
  undefined1 local_79d;
  undefined1 local_79c;
  undefined1 local_79b;
  undefined1 local_79a;
  undefined1 local_799;
  undefined1 *local_798;
  undefined8 local_790;
  string local_788 [32];
  min_function *local_768;
  allocator<char> local_75c;
  undefined1 local_75b;
  undefined1 local_75a;
  undefined1 local_759;
  undefined1 *local_758;
  undefined8 local_750;
  string local_748 [32];
  map_function *local_728;
  allocator<char> local_71c;
  undefined1 local_71b;
  undefined1 local_71a;
  undefined1 local_719;
  undefined1 *local_718;
  undefined8 local_710;
  string local_708 [32];
  max_by_function *local_6e8;
  allocator<char> local_6df;
  undefined1 local_6de;
  undefined1 local_6dd;
  undefined1 local_6dc;
  undefined1 local_6db;
  undefined1 local_6da;
  undefined1 local_6d9;
  undefined1 *local_6d8;
  undefined8 local_6d0;
  string local_6c8 [32];
  max_function *local_6a8;
  allocator<char> local_69c;
  undefined1 local_69b;
  undefined1 local_69a;
  undefined1 local_699;
  undefined1 *local_698;
  undefined8 local_690;
  string local_688 [32];
  length_function *local_668;
  allocator<char> local_65f;
  undefined1 local_65e;
  undefined1 local_65d;
  undefined1 local_65c;
  undefined1 local_65b;
  undefined1 local_65a;
  undefined1 local_659;
  undefined1 *local_658;
  undefined8 local_650;
  string local_648 [32];
  join_function *local_628;
  allocator<char> local_61d;
  undefined1 local_61c;
  undefined1 local_61b;
  undefined1 local_61a;
  undefined1 local_619;
  undefined1 *local_618;
  undefined8 local_610;
  string local_608 [32];
  floor_function *local_5e8;
  allocator<char> local_5de;
  undefined1 local_5dd;
  undefined1 local_5dc;
  undefined1 local_5db;
  undefined1 local_5da;
  undefined1 local_5d9;
  undefined1 *local_5d8;
  undefined8 local_5d0;
  string local_5c8 [32];
  ends_with_function *local_5a8;
  allocator<char> local_59a;
  undefined1 local_599;
  undefined1 local_598;
  undefined1 local_597;
  undefined1 local_596;
  undefined1 local_595;
  undefined1 local_594;
  undefined1 local_593;
  undefined1 local_592;
  undefined1 local_591;
  undefined1 *local_590;
  undefined8 local_588;
  string local_580 [32];
  contains_function *local_560;
  allocator<char> local_551;
  undefined1 local_550;
  undefined1 local_54f;
  undefined1 local_54e;
  undefined1 local_54d;
  undefined1 local_54c;
  undefined1 local_54b;
  undefined1 local_54a;
  undefined1 local_549;
  undefined1 *local_548;
  undefined8 local_540;
  string local_538 [32];
  ceil_function *local_518;
  allocator<char> local_50d;
  undefined1 local_50c;
  undefined1 local_50b;
  undefined1 local_50a;
  undefined1 local_509;
  undefined1 *local_508;
  undefined8 local_500;
  string local_4f8 [32];
  avg_function *local_4d8;
  allocator<char> local_4cc;
  undefined1 local_4cb;
  undefined1 local_4ca;
  undefined1 local_4c9;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  string local_4b8 [32];
  abs_function *local_498;
  allocator<char> local_48c;
  undefined1 local_48b;
  undefined1 local_48a;
  undefined1 local_489;
  undefined1 *local_488;
  undefined8 local_480;
  string local_478 [32];
  undefined8 *local_458;
  undefined1 *local_450 [5];
  undefined1 local_428 [40];
  undefined1 local_400 [40];
  undefined1 local_3d8 [40];
  undefined1 local_3b0 [40];
  undefined1 local_388 [40];
  undefined1 local_360 [40];
  undefined1 local_338 [40];
  undefined1 local_310 [40];
  undefined1 local_2e8 [40];
  undefined1 local_2c0 [40];
  undefined1 local_298 [40];
  undefined1 local_270 [40];
  undefined1 local_248 [40];
  undefined1 local_220 [40];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined1 local_68 [40];
  undefined8 *local_40;
  undefined8 local_38;
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_8;
  
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::abs_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 abs_func);
    if (iVar2 != 0) {
      abs_function::abs_function((abs_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(abs_function::~abs_function,&get_function::abs_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::abs_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::avg_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 avg_func);
    if (iVar2 != 0) {
      avg_function::avg_function((avg_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(avg_function::~avg_function,&get_function::avg_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::avg_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::ceil_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 ceil_func);
    if (iVar2 != 0) {
      ceil_function::ceil_function((ceil_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(ceil_function::~ceil_function,&get_function::ceil_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::ceil_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::contains_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 contains_func);
    if (iVar2 != 0) {
      contains_function::contains_function((contains_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(contains_function::~contains_function,&get_function::contains_func,&__dso_handle)
      ;
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::contains_func
                         );
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::ends_with_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 ends_with_func);
    if (iVar2 != 0) {
      ends_with_function::ends_with_function((ends_with_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(ends_with_function::~ends_with_function,&get_function::ends_with_func,
                   &__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::
                           ends_with_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::floor_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 floor_func);
    if (iVar2 != 0) {
      floor_function::floor_function((floor_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(floor_function::~floor_function,&get_function::floor_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::floor_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::join_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 join_func);
    if (iVar2 != 0) {
      join_function::join_function((join_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(join_function::~join_function,&get_function::join_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::join_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::length_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 length_func);
    if (iVar2 != 0) {
      length_function::length_function((length_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(length_function::~length_function,&get_function::length_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::length_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::max_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 max_func);
    if (iVar2 != 0) {
      max_function::max_function((max_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(max_function::~max_function,&get_function::max_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::max_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::max_by_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 max_by_func);
    if (iVar2 != 0) {
      max_by_function::max_by_function((max_by_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(max_by_function::~max_by_function,&get_function::max_by_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::max_by_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::map_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 map_func);
    if (iVar2 != 0) {
      map_function::map_function((map_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(map_function::~map_function,&get_function::map_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::map_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::merge_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 merge_func);
    if (iVar2 != 0) {
      merge_function::merge_function((merge_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(merge_function::~merge_function,&get_function::merge_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::merge_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::min_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 min_func);
    if (iVar2 != 0) {
      min_function::min_function((min_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(min_function::~min_function,&get_function::min_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::min_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::min_by_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 min_by_func);
    if (iVar2 != 0) {
      min_by_function::min_by_function((min_by_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(min_by_function::~min_by_function,&get_function::min_by_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::min_by_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::type_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 type_func);
    if (iVar2 != 0) {
      type_function::type_function((type_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(type_function::~type_function,&get_function::type_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::type_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sort_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 sort_func);
    if (iVar2 != 0) {
      sort_function::sort_function((sort_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(sort_function::~sort_function,&get_function::sort_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::sort_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sort_by_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 sort_by_func);
    if (iVar2 != 0) {
      sort_by_function::sort_by_function((sort_by_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(sort_by_function::~sort_by_function,&get_function::sort_by_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::sort_by_func)
      ;
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::keys_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 keys_func);
    if (iVar2 != 0) {
      keys_function::keys_function((keys_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(keys_function::~keys_function,&get_function::keys_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::keys_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::values_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 values_func);
    if (iVar2 != 0) {
      values_function::values_function((values_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(values_function::~values_function,&get_function::values_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::values_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::reverse_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 reverse_func);
    if (iVar2 != 0) {
      reverse_function::reverse_function((reverse_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(reverse_function::~reverse_function,&get_function::reverse_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::reverse_func)
      ;
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
      starts_with_func == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 starts_with_func);
    if (iVar2 != 0) {
      starts_with_function::starts_with_function((starts_with_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(starts_with_function::~starts_with_function,&get_function::starts_with_func,
                   &__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::
                           starts_with_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::sum_func ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 sum_func);
    if (iVar2 != 0) {
      sum_function::sum_function((sum_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(sum_function::~sum_function,&get_function::sum_func,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::sum_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::to_array_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 to_array_func);
    if (iVar2 != 0) {
      to_array_function::to_array_function((to_array_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(to_array_function::~to_array_function,&get_function::to_array_func,&__dso_handle)
      ;
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::to_array_func
                         );
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::to_number_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 to_number_func);
    if (iVar2 != 0) {
      to_number_function::to_number_function((to_number_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(to_number_function::~to_number_function,&get_function::to_number_func,
                   &__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::
                           to_number_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::to_string_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 to_string_func);
    if (iVar2 != 0) {
      to_string_function::to_string_function((to_string_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(to_string_function::~to_string_function,&get_function::to_string_func,
                   &__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::
                           to_string_func);
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::not_null_func
      == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 not_null_func);
    if (iVar2 != 0) {
      not_null_function::not_null_function((not_null_function *)in_stack_fffffffffffff2f0);
      __cxa_atexit(not_null_function::~not_null_function,&get_function::not_null_func,&__dso_handle)
      ;
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::not_null_func
                         );
    }
  }
  if (jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
      functions__abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::static_resources::
                                 get_function(std::__cxx11::string_const&,std::error_code&)::
                                 functions__abi_cxx11_);
    if (iVar2 != 0) {
      local_b11 = 1;
      local_458 = local_450;
      local_48b = 0x61;
      local_48a = 0x62;
      local_489 = 0x73;
      local_488 = &local_48b;
      local_480 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,local_488,local_480,&local_48c);
      local_498 = &get_function::abs_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::abs_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (abs_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_428;
      local_4cb = 0x61;
      local_4ca = 0x76;
      local_4c9 = 0x67;
      local_4c8 = &local_4cb;
      local_4c0 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b8,local_4c8,local_4c0,&local_4cc);
      local_4d8 = &get_function::avg_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::avg_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (avg_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_400;
      local_50c = 99;
      local_50b = 0x65;
      local_50a = 0x69;
      local_509 = 0x6c;
      local_508 = &local_50c;
      local_500 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,local_508,local_500,&local_50d);
      local_518 = &get_function::ceil_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::ceil_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (ceil_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_3d8;
      local_550 = 99;
      local_54f = 0x6f;
      local_54e = 0x6e;
      local_54d = 0x74;
      local_54c = 0x61;
      local_54b = 0x69;
      local_54a = 0x6e;
      local_549 = 0x73;
      local_548 = &local_550;
      local_540 = 8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_538,local_548,local_540,&local_551);
      local_560 = &get_function::contains_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::contains_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (contains_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_3b0;
      local_599 = 0x65;
      local_598 = 0x6e;
      local_597 = 100;
      local_596 = 0x73;
      local_595 = 0x5f;
      local_594 = 0x77;
      local_593 = 0x69;
      local_592 = 0x74;
      local_591 = 0x68;
      local_590 = &local_599;
      local_588 = 9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,local_590,local_588,&local_59a);
      local_5a8 = &get_function::ends_with_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::ends_with_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (ends_with_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_388;
      local_5dd = 0x66;
      local_5dc = 0x6c;
      local_5db = 0x6f;
      local_5da = 0x6f;
      local_5d9 = 0x72;
      local_5d8 = &local_5dd;
      local_5d0 = 5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,local_5d8,local_5d0,&local_5de);
      local_5e8 = &get_function::floor_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::floor_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (floor_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_360;
      local_61c = 0x6a;
      local_61b = 0x6f;
      local_61a = 0x69;
      local_619 = 0x6e;
      local_618 = &local_61c;
      local_610 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,local_618,local_610,&local_61d);
      local_628 = &get_function::join_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::join_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (join_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_338;
      local_65e = 0x6c;
      local_65d = 0x65;
      local_65c = 0x6e;
      local_65b = 0x67;
      local_65a = 0x74;
      local_659 = 0x68;
      local_658 = &local_65e;
      local_650 = 6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,local_658,local_650,&local_65f);
      local_668 = &get_function::length_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::length_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (length_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_310;
      local_69b = 0x6d;
      local_69a = 0x61;
      local_699 = 0x78;
      local_698 = &local_69b;
      local_690 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,local_698,local_690,&local_69c);
      local_6a8 = &get_function::max_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::max_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (max_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_2e8;
      local_6de = 0x6d;
      local_6dd = 0x61;
      local_6dc = 0x78;
      local_6db = 0x5f;
      local_6da = 0x62;
      local_6d9 = 0x79;
      local_6d8 = &local_6de;
      local_6d0 = 6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c8,local_6d8,local_6d0,&local_6df);
      local_6e8 = &get_function::max_by_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::max_by_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (max_by_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_2c0;
      local_71b = 0x6d;
      local_71a = 0x61;
      local_719 = 0x70;
      local_718 = &local_71b;
      local_710 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_708,local_718,local_710,&local_71c);
      local_728 = &get_function::map_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::map_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (map_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_298;
      local_75b = 0x6d;
      local_75a = 0x69;
      local_759 = 0x6e;
      local_758 = &local_75b;
      local_750 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_748,local_758,local_750,&local_75c);
      local_768 = &get_function::min_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::min_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (min_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_270;
      local_79e = 0x6d;
      local_79d = 0x69;
      local_79c = 0x6e;
      local_79b = 0x5f;
      local_79a = 0x62;
      local_799 = 0x79;
      local_798 = &local_79e;
      local_790 = 6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,local_798,local_790,&local_79f);
      local_7a8 = &get_function::min_by_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::min_by_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (min_by_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_248;
      local_7dd = 0x6d;
      local_7dc = 0x65;
      local_7db = 0x72;
      local_7da = 0x67;
      local_7d9 = 0x65;
      local_7d8 = &local_7dd;
      local_7d0 = 5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c8,local_7d8,local_7d0,&local_7de);
      local_7e8 = &get_function::merge_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::merge_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (merge_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_220;
      local_81c = 0x74;
      local_81b = 0x79;
      local_81a = 0x70;
      local_819 = 0x65;
      local_818 = &local_81c;
      local_810 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_808,local_818,local_810,&local_81d);
      local_828 = &get_function::type_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::type_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (type_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_1f8;
      local_85c = 0x73;
      local_85b = 0x6f;
      local_85a = 0x72;
      local_859 = 0x74;
      local_858 = &local_85c;
      local_850 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_848,local_858,local_850,&local_85d);
      local_868 = &get_function::sort_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::sort_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (sort_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_1d0;
      local_89f = 0x73;
      local_89e = 0x6f;
      local_89d = 0x72;
      local_89c = 0x74;
      local_89b = 0x5f;
      local_89a = 0x62;
      local_899 = 0x79;
      local_898 = &local_89f;
      local_890 = 7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_888,local_898,local_890,&local_8a0);
      local_8a8 = &get_function::sort_by_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::sort_by_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (sort_by_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_1a8;
      local_8dc = 0x6b;
      local_8db = 0x65;
      local_8da = 0x79;
      local_8d9 = 0x73;
      local_8d8 = &local_8dc;
      local_8d0 = 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,local_8d8,local_8d0,&local_8dd);
      local_8e8 = &get_function::keys_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::keys_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (keys_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_180;
      local_91e = 0x76;
      local_91d = 0x61;
      local_91c = 0x6c;
      local_91b = 0x75;
      local_91a = 0x65;
      local_919 = 0x73;
      local_918 = &local_91e;
      local_910 = 6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_908,local_918,local_910,&local_91f);
      local_928 = &get_function::values_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::values_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (values_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_158;
      local_95f = 0x72;
      local_95e = 0x65;
      local_95d = 0x76;
      local_95c = 0x65;
      local_95b = 0x72;
      local_95a = 0x73;
      local_959 = 0x65;
      local_958 = &local_95f;
      local_950 = 7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_948,local_958,local_950,&local_960);
      local_968 = &get_function::reverse_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::reverse_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (reverse_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_130;
      local_9a3 = 0x73;
      local_9a2 = 0x74;
      local_9a1 = 0x61;
      local_9a0 = 0x72;
      local_99f = 0x74;
      local_99e = 0x73;
      local_99d = 0x5f;
      local_99c = 0x77;
      local_99b = 0x69;
      local_99a = 0x74;
      local_999 = 0x68;
      local_998 = &local_9a3;
      local_990 = 0xb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_988,local_998,local_990,&local_9a4);
      local_9b0 = &get_function::starts_with_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::starts_with_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (starts_with_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_108;
      local_9e3 = 0x73;
      local_9e2 = 0x75;
      local_9e1 = 0x6d;
      local_9e0 = &local_9e3;
      local_9d8 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d0,local_9e0,local_9d8,&local_9e4);
      local_9f0 = &get_function::sum_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::sum_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (sum_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_e0;
      local_a28 = 0x74;
      local_a27 = 0x6f;
      local_a26 = 0x5f;
      local_a25 = 0x61;
      local_a24 = 0x72;
      local_a23 = 0x72;
      local_a22 = 0x61;
      local_a21 = 0x79;
      local_a20 = &local_a28;
      local_a18 = 8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a10,local_a20,local_a18,&local_a29);
      local_a38 = &get_function::to_array_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::to_array_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (to_array_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_b8;
      local_a71 = 0x74;
      local_a70 = 0x6f;
      local_a6f = 0x5f;
      local_a6e = 0x6e;
      local_a6d = 0x75;
      local_a6c = 0x6d;
      local_a6b = 0x62;
      local_a6a = 0x65;
      local_a69 = 0x72;
      local_a68 = &local_a71;
      local_a60 = 9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a58,local_a68,local_a60,&local_a72);
      local_a80 = &get_function::to_number_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::to_number_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (to_number_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_90;
      local_ab9 = 0x74;
      local_ab8 = 0x6f;
      local_ab7 = 0x5f;
      local_ab6 = 0x73;
      local_ab5 = 0x74;
      local_ab4 = 0x72;
      local_ab3 = 0x69;
      local_ab2 = 0x6e;
      local_ab1 = 0x67;
      local_ab0 = &local_ab9;
      local_aa8 = 9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa0,local_ab0,local_aa8,&local_aba);
      local_ac8 = &get_function::to_string_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::to_string_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (to_string_function **)in_stack_fffffffffffff2e0);
      local_458 = (undefined8 *)local_68;
      local_b00 = 0x6e;
      local_aff = 0x6f;
      local_afe = 0x74;
      local_afd = 0x5f;
      local_afc = 0x6e;
      local_afb = 0x75;
      local_afa = 0x6c;
      local_af9 = 0x6c;
      local_af8 = &local_b00;
      local_af0 = 8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ae8,local_af8,local_af0,&local_b01);
      local_b10 = &get_function::not_null_func;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::not_null_function_*,_true>
                (in_stack_fffffffffffff2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                 (not_null_function **)in_stack_fffffffffffff2e0);
      local_b11 = 0;
      local_40 = local_450;
      local_38 = 0x1a;
      in_stack_fffffffffffff2d8 = local_b14;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                   *)0x4fec3b);
      __l._M_len = in_stack_fffffffffffff310;
      __l._M_array = in_stack_fffffffffffff308;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
      ::unordered_map(in_stack_fffffffffffff300,__l,in_stack_fffffffffffff2f8,
                      (hasher *)in_stack_fffffffffffff2f0,
                      (key_equal *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
                      in_stack_fffffffffffff2d8);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    *)0x4fec85);
      ppuVar4 = (undefined8 **)local_450;
      local_ce8 = (undefined1 **)&local_40;
      do {
        local_ce8 = local_ce8 + -5;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>
                 *)0x4fecb0);
      } while ((undefined8 **)local_ce8 != ppuVar4);
      std::__cxx11::string::~string(local_ae8);
      std::allocator<char>::~allocator(&local_b01);
      std::__cxx11::string::~string(local_aa0);
      std::allocator<char>::~allocator(&local_aba);
      std::__cxx11::string::~string(local_a58);
      std::allocator<char>::~allocator(&local_a72);
      std::__cxx11::string::~string(local_a10);
      std::allocator<char>::~allocator(&local_a29);
      std::__cxx11::string::~string(local_9d0);
      std::allocator<char>::~allocator(&local_9e4);
      std::__cxx11::string::~string(local_988);
      std::allocator<char>::~allocator(&local_9a4);
      std::__cxx11::string::~string(local_948);
      std::allocator<char>::~allocator(&local_960);
      std::__cxx11::string::~string(local_908);
      std::allocator<char>::~allocator(&local_91f);
      std::__cxx11::string::~string(local_8c8);
      std::allocator<char>::~allocator(&local_8dd);
      std::__cxx11::string::~string(local_888);
      std::allocator<char>::~allocator(&local_8a0);
      std::__cxx11::string::~string(local_848);
      std::allocator<char>::~allocator(&local_85d);
      std::__cxx11::string::~string(local_808);
      std::allocator<char>::~allocator(&local_81d);
      std::__cxx11::string::~string(local_7c8);
      std::allocator<char>::~allocator(&local_7de);
      std::__cxx11::string::~string(local_788);
      std::allocator<char>::~allocator(&local_79f);
      std::__cxx11::string::~string(local_748);
      std::allocator<char>::~allocator(&local_75c);
      std::__cxx11::string::~string(local_708);
      std::allocator<char>::~allocator(&local_71c);
      std::__cxx11::string::~string(local_6c8);
      std::allocator<char>::~allocator(&local_6df);
      std::__cxx11::string::~string(local_688);
      std::allocator<char>::~allocator(&local_69c);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator(&local_65f);
      std::__cxx11::string::~string(local_608);
      std::allocator<char>::~allocator(&local_61d);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator(&local_5de);
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator(&local_59a);
      std::__cxx11::string::~string(local_538);
      std::allocator<char>::~allocator(&local_551);
      std::__cxx11::string::~string(local_4f8);
      std::allocator<char>::~allocator(&local_50d);
      std::__cxx11::string::~string(local_4b8);
      std::allocator<char>::~allocator(&local_4cc);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator(&local_48c);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
                   ::~unordered_map,
                   &jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    ::static_resources::get_function(std::__cxx11::string_const&,std::error_code&)::
                    functions__abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::static_resources::
                           get_function(std::__cxx11::string_const&,std::error_code&)::
                           functions__abi_cxx11_);
    }
  }
  local_b20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
               *)in_stack_fffffffffffff2d8,(key_type *)0x4fefa2);
  local_b28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>_>
              *)in_stack_fffffffffffff2d8);
  bVar1 = std::__detail::operator!=(&local_b20,&local_b28);
  if (bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>,_false,_true>
                          *)0x4fefe9);
    local_8 = pvVar3->second;
  }
  else {
    local_b30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                 *)in_stack_fffffffffffff2d8,(key_type *)0x4ffc4b);
    local_b38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::static_resources::MyHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>_>
                *)in_stack_fffffffffffff2d8);
    bVar1 = std::__detail::operator==(&local_b30,&local_b38);
    if (bVar1) {
      std::error_code::operator=((error_code *)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec);
      local_8 = (function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)0x0;
    }
    else {
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_false,_false>
      ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_false,_false>
                    *)0x4ffcb0);
      local_8 = std::
                unique_ptr<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ::get(in_stack_fffffffffffff2e0);
    }
  }
  return local_8;
}

Assistant:

const function_base<Json>* get_function(const string_type& name, std::error_code& ec) const
            {
                static abs_function abs_func;
                static avg_function avg_func;
                static ceil_function ceil_func;
                static contains_function contains_func;
                static ends_with_function ends_with_func;
                static floor_function floor_func;
                static join_function join_func;
                static length_function length_func;
                static max_function max_func;
                static max_by_function max_by_func;
                static map_function map_func;
                static merge_function merge_func;
                static min_function min_func;
                static min_by_function min_by_func;
                static type_function type_func;
                static sort_function sort_func;
                static sort_by_function sort_by_func;
                static keys_function keys_func;
                static values_function values_func;
                static reverse_function reverse_func;
                static starts_with_function starts_with_func;
                static const sum_function sum_func;
                static to_array_function to_array_func;
                static to_number_function to_number_func;
                static to_string_function to_string_func;
                static not_null_function not_null_func;

                using function_dictionary = std::unordered_map<string_type,const function_base<Json>*>;
                static const function_dictionary functions_ =
                {
                    {string_type{'a','b','s'}, &abs_func},
                    {string_type{'a','v','g'}, &avg_func},
                    {string_type{'c','e','i', 'l'}, &ceil_func},
                    {string_type{'c','o','n', 't', 'a', 'i', 'n', 's'}, &contains_func},
                    {string_type{'e','n','d', 's', '_', 'w', 'i', 't', 'h'}, &ends_with_func},
                    {string_type{'f','l','o', 'o', 'r'}, &floor_func},
                    {string_type{'j','o','i', 'n'}, &join_func},
                    {string_type{'l','e','n', 'g', 't', 'h'}, &length_func},
                    {string_type{'m','a','x'}, &max_func},
                    {string_type{'m','a','x','_','b','y'}, &max_by_func},
                    {string_type{'m','a','p'}, &map_func},
                    {string_type{'m','i','n'}, &min_func},
                    {string_type{'m','i','n','_','b','y'}, &min_by_func},
                    {string_type{'m','e','r', 'g', 'e'}, &merge_func},
                    {string_type{'t','y','p', 'e'}, &type_func},
                    {string_type{'s','o','r', 't'}, &sort_func},
                    {string_type{'s','o','r', 't','_','b','y'}, &sort_by_func},
                    {string_type{'k','e','y', 's'}, &keys_func},
                    {string_type{'v','a','l', 'u','e','s'}, &values_func},
                    {string_type{'r','e','v', 'e', 'r', 's','e'}, &reverse_func},
                    {string_type{'s','t','a', 'r','t','s','_','w','i','t','h'}, &starts_with_func},
                    {string_type{'s','u','m'}, &sum_func},
                    {string_type{'t','o','_','a','r','r','a','y',}, &to_array_func},
                    {string_type{'t','o','_', 'n', 'u', 'm','b','e','r'}, &to_number_func},
                    {string_type{'t','o','_', 's', 't', 'r','i','n','g'}, &to_string_func},
                    {string_type{'n','o','t', '_', 'n', 'u','l','l'}, &not_null_func}
                };

                auto it = functions_.find(name);
                if (it != functions_.end())
                {
                    return (*it).second;
                }
                auto it2 = custom_functions_.find(name);
                if (it2 == custom_functions_.end())
                {
                    ec = jmespath_errc::unknown_function;
                    return nullptr;
                }
                return it2->second.get();
            }